

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O2

bool __thiscall
astar::AStar::InOpenZone
          (AStar *this,
          priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
          *pc,Point *point)

{
  int iVar1;
  int iVar2;
  PointCost *pointCost;
  PointCost *pPVar3;
  int iVar4;
  int iVar5;
  value_type tmp;
  PointCost local_50;
  
  do {
    pointCost = (pc->c).
                super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pPVar3 = (pc->c).
             super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pointCost == pPVar3) break;
    PointCost::PointCost(&local_50,pointCost);
    std::
    priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
    ::pop(pc);
    iVar5 = local_50.point.y;
    iVar4 = local_50.point.x;
    iVar1 = point->x;
    iVar2 = point->y;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.parent.
                super___shared_ptr<astar::AStar::PointCost,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  } while ((iVar1 != iVar4) || (iVar2 != iVar5));
  return pointCost != pPVar3;
}

Assistant:

bool InOpenZone(std::priority_queue<PointCost> pc, const Point& point)
    {
        while (!pc.empty()) {
            auto tmp = pc.top();
            pc.pop();
            if (point == tmp.point) {
                return true;
            }
        }
        return false;
    }